

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O3

int __thiscall
deqp::gls::BufferTestUtil::IndexArrayVerifier::verify
          (IndexArrayVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  CallLogWrapper *pCVar1;
  long *plVar2;
  byte bVar3;
  RenderContext *pRVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  void *__s;
  undefined8 *__s_00;
  long lVar7;
  undefined8 *puVar8;
  TextureFormat *pTVar9;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 extraout_RAX_01;
  undefined8 uVar10;
  long lVar11;
  TextureFormat TVar12;
  long lVar13;
  pointer pVVar14;
  ulong uVar15;
  void *pvVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint count;
  int height;
  float fVar20;
  float fVar21;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> colors;
  string imageSetDesc;
  RGBA threshold;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> positions;
  Surface referenceImg;
  Surface indexBufferImg;
  Random rnd;
  TextureFormat local_308;
  TextureFormat local_300;
  ulong local_2f8;
  TextureFormat TStack_2f0;
  vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_> local_2e8;
  long *local_2c8;
  undefined8 local_2c0;
  long local_2b8;
  undefined8 uStack_2b0;
  long *local_2a8;
  undefined8 local_2a0;
  long local_298;
  undefined8 uStack_290;
  uchar *local_288;
  CallLogWrapper *local_280;
  int local_274;
  int local_270;
  RGBA local_26c;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_268;
  ulong *local_248;
  long local_240;
  ulong local_238 [2];
  uchar *local_228;
  size_t local_220;
  ulong *local_218;
  long local_210;
  ulong local_208 [2];
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  Surface local_1d8;
  Surface local_1c0;
  PixelBufferAccess local_1a8 [2];
  ios_base local_138 [264];
  
  local_288 = tbs;
  local_228 = sig;
  local_220 = siglen;
  iVar6 = (*((this->super_BufferVerifierBase).m_renderCtx)->_vptr_RenderContext[4])();
  iVar17 = *(int *)CONCAT44(extraout_var,iVar6);
  if (0x7f < iVar17) {
    iVar17 = 0x80;
  }
  iVar6 = ((int *)CONCAT44(extraout_var,iVar6))[1];
  height = 0x80;
  if (iVar6 < 0x80) {
    height = iVar6;
  }
  local_26c.m_value = 0;
  local_268.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_268.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_268.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2e8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2e8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2e8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  __s = operator_new(0x408);
  memset(__s,0,0x408);
  __s_00 = (undefined8 *)operator_new(0x60c);
  memset(__s_00,0,0x60c);
  tcu::Surface::Surface(&local_1c0,iVar17,height);
  tcu::Surface::Surface(&local_1d8,iVar17,height);
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::resize
            (&local_268,0x100);
  lVar7 = 4;
  lVar11 = 0;
  do {
    fVar20 = (float)(int)lVar11 / 15.0;
    lVar13 = 0;
    do {
      fVar21 = (float)(int)lVar13 / 15.0;
      *(float *)((long)local_268.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar13].m_data + lVar7 + -4) =
           fVar21 + fVar21 + -1.0;
      *(float *)((long)local_268.
                       super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar13].m_data + lVar7) =
           fVar20 + fVar20 + -1.0;
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x10);
    lVar11 = lVar11 + 1;
    lVar7 = lVar7 + 0x80;
  } while (lVar11 != 0x10);
  deRandom_init((deRandom *)local_1a8,0xabc231);
  std::vector<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>::resize
            (&local_2e8,0x100);
  if (local_2e8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_2e8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pVVar14 = local_2e8.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      fVar20 = deRandom_getFloat((deRandom *)local_1a8);
      pVVar14->m_data[0] = fVar20 * 0.4 + 0.1;
      fVar20 = deRandom_getFloat((deRandom *)local_1a8);
      pVVar14->m_data[1] = fVar20 * 0.4 + 0.1;
      fVar20 = deRandom_getFloat((deRandom *)local_1a8);
      pVVar14->m_data[2] = fVar20 * 0.4 + 0.1;
      pVVar14 = pVVar14 + 1;
    } while (pVVar14 !=
             local_2e8.
             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  pCVar1 = &(this->super_BufferVerifierBase).super_CallLogWrapper;
  glu::CallLogWrapper::glBindVertexArray(pCVar1,this->m_vao);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x88eb,0);
  glu::CallLogWrapper::glBindBuffer(pCVar1,0x8893,(GLuint)ctx);
  glu::CallLogWrapper::glViewport(pCVar1,0,0,iVar17,height);
  glu::CallLogWrapper::glClearColor(pCVar1,0.0,0.0,0.0,1.0);
  glu::CallLogWrapper::glUseProgram(pCVar1,(this->m_program->m_program).m_program);
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar1,this->m_posLoc);
  glu::CallLogWrapper::glEnableVertexAttribArray(pCVar1,this->m_colorLoc);
  glu::CallLogWrapper::glEnable(pCVar1,0xbe2);
  glu::CallLogWrapper::glBlendFunc(pCVar1,1,1);
  glu::CallLogWrapper::glBlendEquation(pCVar1,0x8006);
  local_274 = (int)local_288 + -2;
  local_228 = local_228 + (int)local_220;
  iVar17 = 0;
  local_280 = pCVar1;
  do {
    uVar18 = (int)local_288 - iVar17;
    iVar6 = iVar17;
    if (uVar18 == 0 || (int)local_288 < iVar17) break;
    count = 0x81;
    if (uVar18 < 0x81) {
      count = uVar18;
    }
    uVar19 = uVar18;
    if (1 < (int)uVar18) {
      uVar19 = count;
    }
    if ((int)uVar18 < 2) {
      iVar6 = local_274;
      count = 2;
    }
    local_248 = local_238;
    local_270 = iVar17;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"Bytes ","");
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    iVar17 = (int)local_220 + iVar6;
    std::ostream::operator<<((ostringstream *)local_1a8,iVar17);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar15 = 0xf;
    if (local_248 != local_238) {
      uVar15 = local_238[0];
    }
    if (uVar15 < (ulong)(local_1f0 + local_240)) {
      uVar15 = 0xf;
      if (local_1f8 != local_1e8) {
        uVar15 = local_1e8[0];
      }
      if (uVar15 < (ulong)(local_1f0 + local_240)) goto LAB_0187ecbf;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1f8,0,(char *)0x0,(ulong)local_248);
    }
    else {
LAB_0187ecbf:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_248,(ulong)local_1f8);
    }
    local_2c8 = &local_2b8;
    plVar2 = puVar8 + 2;
    if ((long *)*puVar8 == plVar2) {
      local_2b8 = *plVar2;
      uStack_2b0 = puVar8[3];
    }
    else {
      local_2b8 = *plVar2;
      local_2c8 = (long *)*puVar8;
    }
    local_2c0 = puVar8[1];
    *puVar8 = plVar2;
    puVar8[1] = 0;
    *(undefined1 *)plVar2 = 0;
    pTVar9 = (TextureFormat *)std::__cxx11::string::append((char *)&local_2c8);
    local_308 = (TextureFormat)&local_2f8;
    TVar12 = (TextureFormat)(pTVar9 + 2);
    if (*pTVar9 == TVar12) {
      local_2f8 = *(ulong *)TVar12;
      TStack_2f0 = pTVar9[3];
    }
    else {
      local_2f8 = *(ulong *)TVar12;
      local_308 = *pTVar9;
    }
    local_300 = pTVar9[1];
    *pTVar9 = TVar12;
    pTVar9[1].order = R;
    pTVar9[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar9[2].order = R;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::operator<<((ostringstream *)local_1a8,count + iVar17 + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar15 = 0xf;
    if (local_308 != (TextureFormat)&local_2f8) {
      uVar15 = local_2f8;
    }
    if (uVar15 < (ulong)(local_210 + (long)local_300)) {
      uVar15 = 0xf;
      if (local_218 != local_208) {
        uVar15 = local_208[0];
      }
      if (uVar15 < (ulong)(local_210 + (long)local_300)) goto LAB_0187ee28;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_218,0,(char *)0x0,(ulong)local_308);
    }
    else {
LAB_0187ee28:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_308,(ulong)local_218);
    }
    local_2a8 = &local_298;
    plVar2 = puVar8 + 2;
    if ((long *)*puVar8 == plVar2) {
      local_298 = *plVar2;
      uStack_290 = puVar8[3];
    }
    else {
      local_298 = *plVar2;
      local_2a8 = (long *)*puVar8;
    }
    local_2a0 = puVar8[1];
    *puVar8 = plVar2;
    puVar8[1] = 0;
    *(undefined1 *)plVar2 = 0;
    if (local_218 != local_208) {
      operator_delete(local_218,local_208[0] + 1);
    }
    if (local_308 != (TextureFormat)&local_2f8) {
      operator_delete((void *)local_308,local_2f8 + 1);
    }
    if (local_2c8 != &local_2b8) {
      operator_delete(local_2c8,local_2b8 + 1);
    }
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8,local_1e8[0] + 1);
    }
    if (local_248 != local_238) {
      operator_delete(local_248,local_238[0] + 1);
    }
    pCVar1 = local_280;
    glu::CallLogWrapper::glClear(local_280,0x4000);
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,this->m_positionBuf);
    glu::CallLogWrapper::glBufferData
              (pCVar1,0x8892,
               (long)local_268.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_268.
                     super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               local_268.
               super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(pCVar1,this->m_posLoc,2,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,this->m_colorBuf);
    glu::CallLogWrapper::glBufferData
              (pCVar1,0x8892,
               (long)local_2e8.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_2e8.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
               local_2e8.
               super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
               _M_impl.super__Vector_impl_data._M_start,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(pCVar1,this->m_colorLoc,3,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glDrawElements(pCVar1,3,count,0x1401,(void *)(long)iVar17);
    pRVar4 = (this->super_BufferVerifierBase).m_renderCtx;
    local_308.order = RGBA;
    local_308.type = UNORM_INT8;
    pvVar16 = (void *)local_1c0.m_pixels.m_cap;
    if ((void *)local_1c0.m_pixels.m_cap != (void *)0x0) {
      pvVar16 = local_1c0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (local_1a8,&local_308,local_1c0.m_width,local_1c0.m_height,1,pvVar16);
    glu::readPixels(pRVar4,0,0,local_1a8);
    pCVar1 = local_280;
    uVar15 = 0;
    do {
      *(undefined8 *)((long)__s + uVar15 * 8) =
           *(undefined8 *)
            local_268.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start[local_228[uVar15 + (long)iVar6]].m_data;
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
    uVar15 = 0;
    puVar8 = __s_00;
    do {
      bVar3 = local_228[uVar15 + (long)iVar6];
      *(float *)(puVar8 + 1) =
           local_2e8.
           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
           _M_impl.super__Vector_impl_data._M_start[bVar3].m_data[2];
      *puVar8 = *(undefined8 *)
                 local_2e8.
                 super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
                 _M_impl.super__Vector_impl_data._M_start[bVar3].m_data;
      uVar15 = uVar15 + 1;
      puVar8 = (undefined8 *)((long)puVar8 + 0xc);
    } while (count != uVar15);
    glu::CallLogWrapper::glClear(local_280,0x4000);
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,this->m_positionBuf);
    glu::CallLogWrapper::glBufferData(pCVar1,0x8892,0x408,__s,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(pCVar1,this->m_posLoc,2,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glBindBuffer(pCVar1,0x8892,this->m_colorBuf);
    glu::CallLogWrapper::glBufferData(pCVar1,0x8892,0x60c,__s_00,0x88e0);
    glu::CallLogWrapper::glVertexAttribPointer(pCVar1,this->m_colorLoc,3,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glDrawArrays(pCVar1,3,0,count);
    pRVar4 = (this->super_BufferVerifierBase).m_renderCtx;
    local_308.order = RGBA;
    local_308.type = UNORM_INT8;
    pvVar16 = (void *)local_1d8.m_pixels.m_cap;
    if ((void *)local_1d8.m_pixels.m_cap != (void *)0x0) {
      pvVar16 = local_1d8.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (local_1a8,&local_308,local_1d8.m_width,local_1d8.m_height,1,pvVar16);
    glu::readPixels(pRVar4,0,0,local_1a8);
    bVar5 = tcu::pixelThresholdCompare
                      ((this->super_BufferVerifierBase).m_log,"RenderResult",(char *)local_2a8,
                       &local_1d8,&local_1c0,&local_26c,COMPARE_LOG_RESULT);
    if (local_2a8 != &local_298) {
      operator_delete(local_2a8,local_298 + 1);
    }
    iVar17 = uVar19 + local_270;
    iVar6 = local_270;
  } while (bVar5);
  glu::CallLogWrapper::glBindVertexArray(local_280,0);
  tcu::Surface::~Surface(&local_1d8);
  tcu::Surface::~Surface(&local_1c0);
  operator_delete(__s_00,0x60c);
  operator_delete(__s,0x408);
  uVar10 = extraout_RAX;
  if (local_2e8.super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    uVar10 = extraout_RAX_00;
  }
  if (local_268.super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_268.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
    uVar10 = extraout_RAX_01;
  }
  return (int)CONCAT71((int7)((ulong)uVar10 >> 8),(int)local_288 <= iVar6);
}

Assistant:

bool IndexArrayVerifier::verify (deUint32 buffer, const deUint8* refPtr, int offset, int numBytes)
{
	const tcu::RenderTarget&	renderTarget		= m_renderCtx.getRenderTarget();
	const int					viewportW			= de::min<int>(INDEX_ARRAY_DRAW_VIEWPORT_WIDTH, renderTarget.getWidth());
	const int					viewportH			= de::min<int>(INDEX_ARRAY_DRAW_VIEWPORT_HEIGHT, renderTarget.getHeight());
	const int					minBytesPerBatch	= 2;
	const tcu::RGBA				threshold			(0,0,0,0);

	std::vector<tcu::Vec2>		positions;
	std::vector<tcu::Vec3>		colors;

	std::vector<tcu::Vec2>		fetchedPos			(MAX_LINES_PER_INDEX_ARRAY_DRAW+1);
	std::vector<tcu::Vec3>		fetchedColor		(MAX_LINES_PER_INDEX_ARRAY_DRAW+1);

	tcu::Surface				indexBufferImg		(viewportW, viewportH);
	tcu::Surface				referenceImg		(viewportW, viewportH);

	int							numVerified			= 0;
	bool						isOk				= true;

	DE_STATIC_ASSERT(sizeof(tcu::Vec2) == sizeof(float)*2);
	DE_STATIC_ASSERT(sizeof(tcu::Vec3) == sizeof(float)*3);

	computeIndexVerifierPositions(positions);
	computeIndexVerifierColors(colors);

	// Reset buffer bindings.
	glBindVertexArray			(m_vao);
	glBindBuffer				(GL_PIXEL_PACK_BUFFER,		0);
	glBindBuffer				(GL_ELEMENT_ARRAY_BUFFER,	buffer);

	// Setup rendering state.
	glViewport					(0, 0, viewportW, viewportH);
	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(m_posLoc);
	glEnableVertexAttribArray	(m_colorLoc);
	glEnable					(GL_BLEND);
	glBlendFunc					(GL_ONE, GL_ONE);
	glBlendEquation				(GL_FUNC_ADD);

	while (numVerified < numBytes)
	{
		int		numRemaining		= numBytes-numVerified;
		bool	isLeftoverBatch		= numRemaining < minBytesPerBatch;
		int		numBytesToVerify	= isLeftoverBatch ? minBytesPerBatch			: de::min(MAX_LINES_PER_INDEX_ARRAY_DRAW+1, numRemaining);
		int		curOffset			= isLeftoverBatch ? (numBytes-minBytesPerBatch)	: numVerified;
		string	imageSetDesc		= string("Bytes ") + de::toString(offset+curOffset) + " to " + de::toString(offset+curOffset+numBytesToVerify-1);

		// Step 1: Render using index buffer.
		glClear					(GL_COLOR_BUFFER_BIT);

		glBindBuffer			(GL_ARRAY_BUFFER, m_positionBuf);
		glBufferData			(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(positions.size()*sizeof(positions[0])), &positions[0], GL_STREAM_DRAW);
		glVertexAttribPointer	(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL);

		glBindBuffer			(GL_ARRAY_BUFFER, m_colorBuf);
		glBufferData			(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(colors.size()*sizeof(colors[0])), &colors[0], GL_STREAM_DRAW);
		glVertexAttribPointer	(m_colorLoc, 3, GL_FLOAT, GL_FALSE, 0, DE_NULL);

		glDrawElements			(GL_LINE_STRIP, numBytesToVerify, GL_UNSIGNED_BYTE, (void*)(deUintptr)(offset+curOffset));
		glu::readPixels			(m_renderCtx, 0, 0, indexBufferImg.getAccess());

		// Step 2: Do manual fetch and render without index buffer.
		execVertexFetch(&fetchedPos[0], &positions[0], refPtr+offset+curOffset, numBytesToVerify);
		execVertexFetch(&fetchedColor[0], &colors[0], refPtr+offset+curOffset, numBytesToVerify);

		glClear					(GL_COLOR_BUFFER_BIT);

		glBindBuffer			(GL_ARRAY_BUFFER, m_positionBuf);
		glBufferData			(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(fetchedPos.size()*sizeof(fetchedPos[0])), &fetchedPos[0], GL_STREAM_DRAW);
		glVertexAttribPointer	(m_posLoc, 2, GL_FLOAT, GL_FALSE, 0, DE_NULL);

		glBindBuffer			(GL_ARRAY_BUFFER, m_colorBuf);
		glBufferData			(GL_ARRAY_BUFFER, (glw::GLsizeiptr)(fetchedColor.size()*sizeof(fetchedColor[0])), &fetchedColor[0], GL_STREAM_DRAW);
		glVertexAttribPointer	(m_colorLoc, 3, GL_FLOAT, GL_FALSE, 0, DE_NULL);

		glDrawArrays			(GL_LINE_STRIP, 0, numBytesToVerify);
		glu::readPixels			(m_renderCtx, 0, 0, referenceImg.getAccess());

		if (!tcu::pixelThresholdCompare(m_log, "RenderResult", imageSetDesc.c_str(), referenceImg, indexBufferImg, threshold, tcu::COMPARE_LOG_RESULT))
		{
			isOk = false;
			break;
		}

		numVerified += isLeftoverBatch ? numRemaining : numBytesToVerify;
	}

	glBindVertexArray(0);

	return isOk;
}